

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

Vec_Ptr_t * Saig_ManBmcDfsNodes(Aig_Man_t *p,Vec_Ptr_t *vRoots)

{
  Vec_Ptr_t *vNodes;
  void **ppvVar1;
  long lVar2;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar1 = (void **)malloc(800);
  vNodes->pArray = ppvVar1;
  if (0 < vRoots->nSize) {
    lVar2 = 0;
    do {
      Saig_ManBmcDfs_rec(p,(Aig_Obj_t *)
                           (*(ulong *)((long)vRoots->pArray[lVar2] + 8) & 0xfffffffffffffffe),vNodes
                        );
      lVar2 = lVar2 + 1;
    } while (lVar2 < vRoots->nSize);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Saig_ManBmcDfsNodes( Aig_Man_t * p, Vec_Ptr_t * vRoots )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        Saig_ManBmcDfs_rec( p, Aig_ObjFanin0(pObj), vNodes );
    return vNodes;
}